

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O2

void duckdb::RowOperations::HeapScatter
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  SelectionVector *__s;
  bool bVar3;
  uint uVar4;
  NestedValidity *pNVar5;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  idx_t iVar6;
  reference this_00;
  type v_00;
  NotImplementedException *this_01;
  ulong uVar7;
  uint *puVar8;
  uint *puVar9;
  UnifiedVectorFormat *this_02;
  idx_t i;
  idx_t iVar10;
  optional_ptr<duckdb::NestedValidity,_true> local_40d8;
  idx_t local_40d0;
  UnifiedVectorFormat vdata_2;
  string local_4080;
  NestedValidity struct_validity;
  UnifiedVectorFormat vdata;
  
  bVar3 = TypeIsConstantSize((v->type).physical_type_);
  if (bVar3) {
    UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
    Vector::ToUnifiedFormat(v,vcount,&vdata);
    HeapScatterVData(&vdata,(v->type).physical_type_,sel,ser_count,key_locations,parent_validity,
                     offset);
  }
  else {
    PVar1 = (v->type).physical_type_;
    if (PVar1 == LIST) {
      HeapScatterListVector(v,vcount,sel,ser_count,key_locations,parent_validity,offset);
      return;
    }
    if (PVar1 == STRUCT) {
      local_40d8.ptr = parent_validity.ptr;
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata_2);
      Vector::ToUnifiedFormat(v,vcount,&vdata_2);
      local_40d0 = vcount;
      this = StructVector::GetEntries(v);
      uVar7 = ((long)(this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) + 7U >> 3;
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        __s = (SelectionVector *)key_locations[iVar10];
        (&vdata.sel)[iVar10] = __s;
        switchD_016d8eb1::default(__s,0xff,uVar7);
        key_locations[iVar10] = key_locations[iVar10] + uVar7;
        iVar6 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)sel->sel_vector[iVar10];
        }
        if ((vdata_2.sel)->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)(vdata_2.sel)->sel_vector[iVar6];
        }
        if (((local_40d8.ptr != (NestedValidity *)0x0) &&
            (vdata_2.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
             (unsigned_long *)0x0)) &&
           ((vdata_2.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [iVar6 + offset >> 6] >> (iVar6 + offset & 0x3f) & 1) == 0)) {
          pNVar5 = optional_ptr<duckdb::NestedValidity,_true>::operator->(&local_40d8);
          NestedValidity::SetInvalid(pNVar5,iVar10);
        }
      }
      for (uVar7 = 0;
          uVar7 < (ulong)((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1)
      {
        this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this,uVar7);
        v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (this_00);
        NestedValidity::NestedValidity(&struct_validity,(data_ptr_t *)&vdata,uVar7);
        HeapScatter(v_00,local_40d0,sel,ser_count,key_locations,&struct_validity,offset);
      }
      this_02 = &vdata_2;
      goto LAB_0167d82e;
    }
    if (PVar1 == ARRAY) {
      HeapScatterArrayVector(v,vcount,sel,ser_count,key_locations,parent_validity,offset);
      return;
    }
    if (PVar1 != VARCHAR) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&vdata,"Serialization of variable length vector with type %s",
                 (allocator *)&vdata_2);
      LogicalType::ToString_abi_cxx11_(&local_4080,&v->type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this_01,(string *)&vdata,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4080);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    vdata_2.sel = (SelectionVector *)parent_validity.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
    Vector::ToUnifiedFormat(v,vcount,&vdata);
    iVar10 = 0;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar6 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar7 = iVar6 + offset;
        if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(vdata.sel)->sel_vector[uVar7];
        }
        if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6] >>
             (uVar7 & 0x3f) & 1) != 0)) {
          uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                            ((ulong)*(uint *)(vdata.data + uVar7 * 0x10));
          puVar8 = (uint *)(vdata.data + uVar7 * 0x10);
          *(uint *)key_locations[iVar10] = uVar4;
          pdVar2 = key_locations[iVar10];
          key_locations[iVar10] = pdVar2 + 4;
          if ((ulong)*puVar8 < 0xd) {
            puVar9 = puVar8 + 1;
          }
          else {
            puVar9 = *(uint **)(puVar8 + 2);
          }
          switchD_016b45db::default(pdVar2 + 4,puVar9,(ulong)*puVar8);
          key_locations[iVar10] = key_locations[iVar10] + *puVar8;
        }
      }
    }
    else {
      for (; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar6 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar7 = iVar6 + offset;
        if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(vdata.sel)->sel_vector[uVar7];
        }
        if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6] >>
             (uVar7 & 0x3f) & 1) != 0)) {
          uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                            ((ulong)*(uint *)(vdata.data + uVar7 * 0x10));
          puVar8 = (uint *)(vdata.data + uVar7 * 0x10);
          *(uint *)key_locations[iVar10] = uVar4;
          pdVar2 = key_locations[iVar10];
          key_locations[iVar10] = pdVar2 + 4;
          if ((ulong)*puVar8 < 0xd) {
            puVar9 = puVar8 + 1;
          }
          else {
            puVar9 = *(uint **)(puVar8 + 2);
          }
          switchD_016b45db::default(pdVar2 + 4,puVar9,(ulong)*puVar8);
          key_locations[iVar10] = key_locations[iVar10] + *puVar8;
        }
        else {
          pNVar5 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&vdata_2);
          NestedValidity::SetInvalid(pNVar5,iVar10);
        }
      }
    }
  }
  this_02 = &vdata;
LAB_0167d82e:
  UnifiedVectorFormat::~UnifiedVectorFormat(this_02);
  return;
}

Assistant:

void RowOperations::HeapScatter(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                data_ptr_t *key_locations, optional_ptr<NestedValidity> parent_validity, idx_t offset) {
	if (TypeIsConstantSize(v.GetType().InternalType())) {
		UnifiedVectorFormat vdata;
		v.ToUnifiedFormat(vcount, vdata);
		RowOperations::HeapScatterVData(vdata, v.GetType().InternalType(), sel, ser_count, key_locations,
		                                parent_validity, offset);
	} else {
		switch (v.GetType().InternalType()) {
		case PhysicalType::VARCHAR:
			HeapScatterStringVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::STRUCT:
			HeapScatterStructVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::LIST:
			HeapScatterListVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::ARRAY:
			HeapScatterArrayVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		default:
			// LCOV_EXCL_START
			throw NotImplementedException("Serialization of variable length vector with type %s",
			                              v.GetType().ToString());
			// LCOV_EXCL_STOP
		}
	}
}